

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_glsl_op
          (CompilerMSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  BaseType BVar1;
  StorageClass SVar2;
  Variant *pVVar3;
  undefined1 *puVar4;
  uint uVar5;
  string *psVar6;
  byte bVar7;
  bool bVar8;
  uint32_t uVar9;
  uint uVar10;
  GLSLstd450 GVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  SPIRType *pSVar15;
  ulong uVar16;
  SPIRExpression *pSVar17;
  mapped_type *pmVar18;
  char *pcVar19;
  SPIRConstant *pSVar20;
  SPIRVariable *pSVar21;
  CompilerError *this_00;
  uint *ts_1;
  char (*ts_2) [3];
  __node_gen_type __node_gen;
  BaseType input_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ts_2 = (char (*) [3])args;
  uVar9 = CompilerGLSL::get_integer_width_for_glsl_instruction
                    (&this->super_CompilerGLSL,eop,args,count);
  uVar5 = uVar9 - 8 >> 3;
  uVar10 = uVar9 << 0x1d | uVar5;
  if ((7 < uVar10) || ((0x8bU >> (uVar5 & 0x1f) & 1) == 0)) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid bit width.");
LAB_0022021e:
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((0x8bU >> (uVar5 & 0x1f) & 1) == 0) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid bit width.");
    goto LAB_0022021e;
  }
  input_type = *(BaseType *)(&DAT_002be604 + (ulong)uVar10 * 4);
  BVar1 = *(BaseType *)(&DAT_002be624 + (ulong)uVar10 * 4);
  GVar11 = CompilerGLSL::get_remapped_glsl_op(&this->super_CompilerGLSL,eop);
  uVar9 = result_type;
  pSVar15 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + result_type);
  ts_1 = &switchD_0021ee09::switchdataD_002c55b0;
  switch(GVar11) {
  case GLSLstd450RoundEven:
    uVar14 = *args;
    pcVar19 = "rint";
    break;
  default:
    goto LAB_0021fa8b;
  case GLSLstd450Sinh:
    if (pSVar15->basetype != Half) {
      uVar14 = *args;
      pcVar19 = "fast::sinh";
      break;
    }
    CompilerGLSL::to_unpacked_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[17],std::__cxx11::string,char_const(&)[3]>
              (&local_b0,(spirv_cross *)"half(fast::sinh(",(char (*) [17])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d0e93,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    uVar14 = id;
    bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar9,id,&local_b0,bVar8,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,uVar14,*args);
    goto LAB_0021fdeb;
  case GLSLstd450Cosh:
    if (pSVar15->basetype != Half) {
      uVar14 = *args;
      pcVar19 = "fast::cosh";
      break;
    }
    CompilerGLSL::to_unpacked_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[17],std::__cxx11::string,char_const(&)[3]>
              (&local_b0,(spirv_cross *)"half(fast::cosh(",(char (*) [17])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d0e93,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    uVar14 = id;
    bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar9,id,&local_b0,bVar8,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,uVar14,*args);
    goto LAB_0021fdeb;
  case GLSLstd450Tanh:
    if (pSVar15->basetype != Half) {
      uVar14 = *args;
      pcVar19 = "precise::tanh";
      break;
    }
    CompilerGLSL::to_unpacked_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[17],std::__cxx11::string,char_const(&)[3]>
              (&local_b0,(spirv_cross *)"half(fast::tanh(",(char (*) [17])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d0e93,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    uVar14 = id;
    bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar9,id,&local_b0,bVar8,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,uVar14,*args);
    goto LAB_0021fdeb;
  case GLSLstd450Atan2:
    if (pSVar15->basetype != Half) {
      uVar14 = *args;
      uVar12 = args[1];
      pcVar19 = "precise::atan2";
      goto LAB_0021fb18;
    }
    CompilerGLSL::to_unpacked_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,*args,true);
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_90,&this->super_CompilerGLSL,args[1],true);
    join<char_const(&)[18],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&local_b0,(spirv_cross *)"half(fast::atan2(",(char (*) [18])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d38e3,
               (char (*) [3])&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d0e93,
               (char (*) [3])in_stack_ffffffffffffff08);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    uVar14 = id;
    bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    if (bVar8) {
      bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    else {
      bVar8 = false;
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar9,id,&local_b0,bVar8,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,uVar14,*args);
    Compiler::inherit_expression_dependencies((Compiler *)this,uVar14,args[1]);
    goto LAB_0021fdeb;
  case GLSLstd450Pow:
    uVar14 = *args;
    uVar12 = args[1];
    pcVar19 = "powr";
    goto LAB_0021fb18;
  case GLSLstd450InverseSqrt:
    uVar14 = *args;
    pcVar19 = "rsqrt";
    break;
  case GLSLstd450MatrixInverse:
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar14 = pSVar15->columns;
    if (uVar14 == 4) {
      uVar14 = *args;
      pcVar19 = "spvInverse4x4";
    }
    else if (uVar14 == 3) {
      uVar14 = *args;
      pcVar19 = "spvInverse3x3";
    }
    else {
      if (uVar14 != 2) {
        return;
      }
      uVar14 = *args;
      pcVar19 = "spvInverse2x2";
    }
    break;
  case GLSLstd450Modf:
  case GLSLstd450Frexp:
    uVar16 = (ulong)args[1];
    if ((uVar16 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar16].type == TypeExpression))
    {
      pSVar17 = Variant::get<spirv_cross::SPIRExpression>(pVVar3 + uVar16);
    }
    else {
      pSVar17 = (SPIRExpression *)0x0;
    }
    pSVar15 = Compiler::expression_type((Compiler *)this,args[1]);
    SVar2 = pSVar15->storage;
    bVar7 = (byte)(0x1ca >> ((byte)SVar2 & 0x1f)) & SVar2 < StorageClassPushConstant;
    if (SVar2 == StorageClassOutput) {
      bVar7 = bVar7 & (this->capture_output_to_buffer ^ 1U);
    }
    if (bVar7 != 0) {
      if ((pSVar17 == (SPIRExpression *)0x0) || (pSVar17->access_chain != true)) goto LAB_0021fa8b;
      pSVar15 = Compiler::expression_type((Compiler *)this,args[1]);
      bVar8 = Compiler::is_scalar((Compiler *)this,pSVar15);
      if (!bVar8) goto LAB_0021fa8b;
    }
    CompilerGLSL::register_call_out_argument(&this->super_CompilerGLSL,args[1]);
    local_b0._M_dataplus._M_p =
         (pointer)&(this->super_CompilerGLSL).super_Compiler.forced_temporaries;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_b0._M_dataplus._M_p,&stack0xffffffffffffff1c);
    pmVar18 = ::std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&(this->super_CompilerGLSL).extra_sub_expressions,
                           (key_type *)&stack0xffffffffffffff1c);
    if (*pmVar18 == 0) {
      uVar14 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      *pmVar18 = uVar14;
    }
    uVar14 = Compiler::expression_type_id((Compiler *)this,args[1]);
    uVar14 = Compiler::get_pointee_type_id((Compiler *)this,uVar14);
    CompilerGLSL::emit_uninitialized_temporary_expression(&this->super_CompilerGLSL,uVar14,*pmVar18)
    ;
    pcVar19 = "frexp";
    if (eop == 0x23) {
      pcVar19 = "modf";
    }
    CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,uVar9,id,*args,*pmVar18,pcVar19);
    CompilerGLSL::to_expression_abi_cxx11_(&local_b0,&this->super_CompilerGLSL,args[1],true);
    CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,*pmVar18,true);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_b0,(char (*) [4])0x2d6e67,&local_d0,
               (char (*) [2])0x2d6cfb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    goto LAB_0021fdeb;
  case GLSLstd450FMin:
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar14 = *args;
    uVar12 = args[1];
    if (pSVar15->basetype == Float) {
      pcVar19 = "fast::min";
      goto LAB_0021fb18;
    }
    goto LAB_0021f7b6;
  case GLSLstd450FMax:
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar14 = *args;
    uVar12 = args[1];
    if (pSVar15->basetype == Float) {
      pcVar19 = "fast::max";
      goto LAB_0021fb18;
    }
    goto LAB_0021f60e;
  case GLSLstd450FClamp:
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar14 = *args;
    uVar12 = args[1];
    uVar13 = args[2];
    if (pSVar15->basetype == Float) {
      pcVar19 = "fast::clamp";
      goto LAB_0021f7fa;
    }
    goto LAB_0021f5b9;
  case GLSLstd450PackSnorm4x8:
    uVar14 = *args;
    pcVar19 = "pack_float_to_snorm4x8";
    break;
  case GLSLstd450PackUnorm4x8:
    uVar14 = *args;
    pcVar19 = "pack_float_to_unorm4x8";
    break;
  case GLSLstd450PackSnorm2x16:
    uVar14 = *args;
    pcVar19 = "pack_float_to_snorm2x16";
    break;
  case GLSLstd450PackUnorm2x16:
    uVar14 = *args;
    pcVar19 = "pack_float_to_unorm2x16";
    break;
  case GLSLstd450PackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[3]>
              (&local_b0,(spirv_cross *)"as_type<uint>(half2(",(char (*) [21])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d0e93,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    uVar14 = id;
    bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar9,id,&local_b0,bVar8,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,uVar14,*args);
    goto LAB_0021fdeb;
  case GLSLstd450PackDouble2x32:
    uVar14 = *args;
    pcVar19 = "unsupported_GLSLstd450PackDouble2x32";
    break;
  case GLSLstd450UnpackSnorm2x16:
    uVar14 = *args;
    pcVar19 = "unpack_snorm2x16_to_float";
    break;
  case GLSLstd450UnpackUnorm2x16:
    uVar14 = *args;
    pcVar19 = "unpack_unorm2x16_to_float";
    break;
  case GLSLstd450UnpackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[23],std::__cxx11::string,char_const(&)[3]>
              (&local_b0,(spirv_cross *)"float2(as_type<half2>(",(char (*) [23])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d0e93,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    uVar14 = id;
    bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar9,id,&local_b0,bVar8,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,uVar14,*args);
LAB_0021fdeb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
LAB_0021fdf9:
      operator_delete(local_b0._M_dataplus._M_p);
    }
    return;
  case GLSLstd450UnpackSnorm4x8:
    uVar14 = *args;
    pcVar19 = "unpack_snorm4x8_to_float";
    break;
  case GLSLstd450UnpackUnorm4x8:
    uVar14 = *args;
    pcVar19 = "unpack_unorm4x8_to_float";
    break;
  case GLSLstd450UnpackDouble2x32:
    uVar14 = *args;
    pcVar19 = "unsupported_GLSLstd450UnpackDouble2x32";
    break;
  case GLSLstd450Length:
    pSVar15 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar15->vecsize != 1) goto LAB_0021fa8b;
    uVar14 = *args;
    pcVar19 = "abs";
    break;
  case GLSLstd450Distance:
    pSVar15 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar15->vecsize == 1) {
      uVar14 = id;
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,*args,true);
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_90,&this->super_CompilerGLSL,args[1],true);
      join<char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (&local_b0,(spirv_cross *)"abs(",(char (*) [5])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c2817,
                 (char (*) [4])&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,
                 (char (*) [2])in_stack_ffffffffffffff08);
      bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      if (bVar8) {
        bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
      }
      else {
        bVar8 = false;
      }
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar9,id,&local_b0,bVar8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      Compiler::inherit_expression_dependencies((Compiler *)this,uVar14,*args);
      Compiler::inherit_expression_dependencies((Compiler *)this,uVar14,args[1]);
      return;
    }
    goto LAB_0021fa8b;
  case GLSLstd450Normalize:
    pSVar15 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar15->vecsize == 1) {
      uVar14 = *args;
      pcVar19 = "sign";
    }
    else {
      uVar14 = *args;
      if ((pSVar15->vecsize < 4) && (pSVar15->basetype == Half)) {
        pcVar19 = "normalize";
      }
      else {
        pcVar19 = "fast::normalize";
      }
    }
    break;
  case GLSLstd450FaceForward:
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar15->vecsize == 1) {
      uVar14 = *args;
      uVar12 = args[1];
      uVar13 = args[2];
      pcVar19 = "spvFaceForward";
      goto LAB_0021f7fa;
    }
    goto LAB_0021fa8b;
  case GLSLstd450Reflect:
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar15->vecsize == 1) {
      uVar14 = *args;
      uVar12 = args[1];
      pcVar19 = "spvReflect";
      goto LAB_0021fb18;
    }
    goto LAB_0021fa8b;
  case GLSLstd450Refract:
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar15->vecsize == 1) {
      uVar14 = *args;
      uVar12 = args[1];
      uVar13 = args[2];
      pcVar19 = "spvRefract";
      goto LAB_0021f7fa;
    }
LAB_0021fa8b:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,uVar9,id,eop,args,count);
    return;
  case GLSLstd450FindILsb:
    pSVar15 = Compiler::expression_type((Compiler *)this,*args);
    input_type = pSVar15->basetype;
    uVar14 = *args;
    pcVar19 = "spvFindLSB";
    goto LAB_0021f466;
  case GLSLstd450FindSMsb:
    uVar14 = *args;
    pcVar19 = "spvFindSMSB";
    goto LAB_0021f466;
  case GLSLstd450FindUMsb:
    uVar14 = *args;
    pcVar19 = "spvFindUMSB";
    input_type = BVar1;
LAB_0021f466:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,uVar9,id,uVar14,pcVar19,input_type,input_type);
    return;
  case GLSLstd450InterpolateAtCentroid:
    uVar14 = Compiler::get_extended_decoration
                       ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    bVar8 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar8) {
      uVar12 = Compiler::get_extended_decoration
                         ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      uVar16 = (ulong)uVar12;
      if ((uVar16 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (ts_1 = (uint *)(this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr,
         ((Variant *)((long)ts_1 + uVar16 * 0x18))->type == TypeConstant)) {
        pSVar20 = Variant::get<spirv_cross::SPIRConstant>((Variant *)((long)ts_1 + uVar16 * 0x18));
      }
      else {
        pSVar20 = (SPIRConstant *)0x0;
      }
      if ((pSVar20 == (SPIRConstant *)0x0) || (pSVar20->specialization == true)) {
        CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,uVar12,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d0,(spirv_cross *)0x2c1a1a,(char (*) [2])&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c191f,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      else {
        local_90._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar20->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d0,(spirv_cross *)0x2bd45a,(char (*) [2])&local_90,(char **)ts_1);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_90,this,(ulong)(this->stage_in_var_id).id,1);
    pSVar21 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id);
    pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar21);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar15,uVar14);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[27],std::__cxx11::string&>
              (&local_d0,(spirv_cross *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd45a,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_centroid()",(char (*) [27])&local_b0,in_stack_ffffffffffffff08);
    bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar9,id,&local_d0,bVar8,false);
    psVar6 = &local_d0;
    goto LAB_0022019a;
  case GLSLstd450InterpolateAtSample:
    uVar12 = Compiler::get_extended_decoration
                       ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    bVar8 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    uVar14 = uVar9;
    if (bVar8) {
      uVar13 = Compiler::get_extended_decoration
                         ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      uVar16 = (ulong)uVar13;
      if ((uVar16 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (ts_1 = (uint *)(this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr,
         ((Variant *)((long)ts_1 + uVar16 * 0x18))->type == TypeConstant)) {
        pSVar20 = Variant::get<spirv_cross::SPIRConstant>((Variant *)((long)ts_1 + uVar16 * 0x18));
      }
      else {
        pSVar20 = (SPIRConstant *)0x0;
      }
      if ((pSVar20 == (SPIRConstant *)0x0) || (pSVar20->specialization == true)) {
        CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,uVar13,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d0,(spirv_cross *)0x2c1a1a,(char (*) [2])&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c191f,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      else {
        local_90._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar20->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d0,(spirv_cross *)0x2bd45a,(char (*) [2])&local_90,(char **)ts_1);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
    }
    uVar13 = id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_90,this,(ulong)(this->stage_in_var_id).id,1);
    pSVar21 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id);
    pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar21);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar15,uVar12);
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,args[1],true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (&local_d0,(spirv_cross *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd45a,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_sample(",(char (*) [24])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,
               (char (*) [2])&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(uVar13,uVar14));
    bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    if (bVar8) {
      bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    else {
      bVar8 = false;
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar9,id,&local_d0,bVar8,false);
    goto LAB_0022017f;
  case GLSLstd450InterpolateAtOffset:
    uVar12 = Compiler::get_extended_decoration
                       ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    bVar8 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    uVar14 = uVar9;
    if (bVar8) {
      uVar13 = Compiler::get_extended_decoration
                         ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      uVar16 = (ulong)uVar13;
      if ((uVar16 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (ts_1 = (uint *)(this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr,
         ((Variant *)((long)ts_1 + uVar16 * 0x18))->type == TypeConstant)) {
        pSVar20 = Variant::get<spirv_cross::SPIRConstant>((Variant *)((long)ts_1 + uVar16 * 0x18));
      }
      else {
        pSVar20 = (SPIRConstant *)0x0;
      }
      if ((pSVar20 == (SPIRConstant *)0x0) || (pSVar20->specialization == true)) {
        CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,uVar13,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d0,(spirv_cross *)0x2c1a1a,(char (*) [2])&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c191f,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      else {
        local_90._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar20->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d0,(spirv_cross *)0x2bd45a,(char (*) [2])&local_90,(char **)ts_1);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
    }
    uVar13 = id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_90,this,(ulong)(this->stage_in_var_id).id,1);
    pSVar21 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id);
    pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar21);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar15,uVar12);
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,args[1],true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[11],std::__cxx11::string&>
              (&local_d0,(spirv_cross *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd45a,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_offset(",(char (*) [24])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + 0.4375)",
               (char (*) [11])&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(uVar13,uVar14));
    bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    if (bVar8) {
      bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    else {
      bVar8 = false;
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar9,id,&local_d0,bVar8,false);
LAB_0022017f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    psVar6 = &local_50;
LAB_0022019a:
    puVar4 = *(undefined1 **)((psVar6->field_2)._M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4 != &psVar6->field_2) {
      operator_delete(puVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return;
    }
    goto LAB_0021fdf9;
  case GLSLstd450NMin:
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar14 = *args;
    uVar12 = args[1];
    if (pSVar15->basetype == Float) {
      pcVar19 = "precise::min";
      goto LAB_0021fb18;
    }
LAB_0021f7b6:
    pcVar19 = "min";
LAB_0021fb18:
    CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,uVar9,id,uVar14,uVar12,pcVar19);
    return;
  case GLSLstd450NMax:
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar14 = *args;
    uVar12 = args[1];
    if (pSVar15->basetype == Float) {
      pcVar19 = "precise::max";
      goto LAB_0021fb18;
    }
LAB_0021f60e:
    pcVar19 = "max";
    goto LAB_0021fb18;
  case GLSLstd450NClamp:
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar14 = *args;
    uVar12 = args[1];
    uVar13 = args[2];
    if (pSVar15->basetype == Float) {
      pcVar19 = "precise::clamp";
      goto LAB_0021f7fa;
    }
LAB_0021f5b9:
    pcVar19 = "clamp";
LAB_0021f7fa:
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,uVar9,id,uVar14,uVar12,uVar13,pcVar19);
    return;
  }
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,uVar9,id,uVar14,pcVar19);
  return;
}

Assistant:

void CompilerMSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	op = get_remapped_glsl_op(op);

	auto &restype = get<SPIRType>(result_type);

	switch (op)
	{
	case GLSLstd450Sinh:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::sinh(", to_unpacked_expression(args[0]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]));
			inherit_expression_dependencies(id, args[0]);
		}
		else
			emit_unary_func_op(result_type, id, args[0], "fast::sinh");
		break;
	case GLSLstd450Cosh:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::cosh(", to_unpacked_expression(args[0]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]));
			inherit_expression_dependencies(id, args[0]);
		}
		else
			emit_unary_func_op(result_type, id, args[0], "fast::cosh");
		break;
	case GLSLstd450Tanh:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::tanh(", to_unpacked_expression(args[0]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]));
			inherit_expression_dependencies(id, args[0]);
		}
		else
			emit_unary_func_op(result_type, id, args[0], "precise::tanh");
		break;
	case GLSLstd450Atan2:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::atan2(", to_unpacked_expression(args[0]), ", ", to_unpacked_expression(args[1]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::atan2");
		break;
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;
	case GLSLstd450RoundEven:
		emit_unary_func_op(result_type, id, args[0], "rint");
		break;

	case GLSLstd450FindILsb:
	{
		// In this template version of findLSB, we return T.
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindLSB", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindSMSB", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindUMSB", uint_type, uint_type);
		break;

	case GLSLstd450PackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm4x8");
		break;
	case GLSLstd450PackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm4x8");
		break;
	case GLSLstd450PackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm2x16");
		break;
	case GLSLstd450PackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm2x16");
		break;

	case GLSLstd450PackHalf2x16:
	{
		auto expr = join("as_type<uint>(half2(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450UnpackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm4x8_to_float");
		break;
	case GLSLstd450UnpackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm4x8_to_float");
		break;
	case GLSLstd450UnpackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm2x16_to_float");
		break;
	case GLSLstd450UnpackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm2x16_to_float");
		break;

	case GLSLstd450UnpackHalf2x16:
	{
		auto expr = join("float2(as_type<half2>(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450PackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450PackDouble2x32"); // Currently unsupported
		break;
	case GLSLstd450UnpackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450UnpackDouble2x32"); // Currently unsupported
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &mat_type = get<SPIRType>(result_type);
		switch (mat_type.columns)
		{
		case 2:
			emit_unary_func_op(result_type, id, args[0], "spvInverse2x2");
			break;
		case 3:
			emit_unary_func_op(result_type, id, args[0], "spvInverse3x3");
			break;
		case 4:
			emit_unary_func_op(result_type, id, args[0], "spvInverse4x4");
			break;
		default:
			break;
		}
		break;
	}

	case GLSLstd450FMin:
		// If the result type isn't float, don't bother calling the specific
		// precise::/fast:: version. Metal doesn't have those for half and
		// double types.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::min");
		break;

	case GLSLstd450FMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::max");
		break;

	case GLSLstd450FClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "fast::clamp");
		break;

	case GLSLstd450NMin:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::min");
		break;

	case GLSLstd450NMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::max");
		break;

	case GLSLstd450NClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "precise::clamp");
		break;

	case GLSLstd450InterpolateAtCentroid:
	{
		// We can't just emit the expression normally, because the qualified name contains a call to the default
		// interpolate method, or refers to a local variable. We saved the interface index we need; use it to construct
		// the base for the method call.
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_centroid()", component),
		        should_forward(args[0]));
		break;
	}

	case GLSLstd450InterpolateAtSample:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_sample(", to_expression(args[1]), ")", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450InterpolateAtOffset:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		// Like Direct3D, Metal puts the (0, 0) at the upper-left corner, not the center as SPIR-V and GLSL do.
		// Offset the offset by (1/2 - 1/16), or 0.4375, to compensate for this.
		// It has to be (1/2 - 1/16) and not 1/2, or several CTS tests subtly break on Intel.
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_offset(", to_expression(args[1]), " + 0.4375)", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450Distance:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Equivalent to length(a - b) -> abs(a - b).
			emit_op(result_type, id,
			        join("abs(", to_enclosed_unpacked_expression(args[0]), " - ",
			             to_enclosed_unpacked_expression(args[1]), ")"),
			        should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Length:
		// MSL does not support scalar versions, so use abs().
		if (expression_type(args[0]).vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "abs");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Normalize:
	{
		auto &exp_type = expression_type(args[0]);
		// MSL does not support scalar versions here.
		// MSL has no implementation for normalize in the fast:: namespace for half2 and half3
		// Returns -1 or 1 for valid input, sign() does the job.
		if (exp_type.vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "sign");
		else if (exp_type.vecsize <= 3 && exp_type.basetype == SPIRType::Half)
			emit_unary_func_op(result_type, id, args[0], "normalize");
		else
			emit_unary_func_op(result_type, id, args[0], "fast::normalize");
		break;
	}
	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_binary_func_op(result_type, id, args[0], args[1], "spvReflect");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvRefract");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvFaceForward");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Modf:
	case GLSLstd450Frexp:
	{
		// Special case. If the variable is a scalar access chain, we cannot use it directly. We have to emit a temporary.
		// Another special case is if the variable is in a storage class which is not thread.
		auto *ptr = maybe_get<SPIRExpression>(args[1]);
		auto &type = expression_type(args[1]);

		bool is_thread_storage = storage_class_array_is_thread(type.storage);
		if (type.storage == StorageClassOutput && capture_output_to_buffer)
			is_thread_storage = false;

		if (!is_thread_storage ||
		    (ptr && ptr->access_chain && is_scalar(expression_type(args[1]))))
		{
			register_call_out_argument(args[1]);
			forced_temporaries.insert(id);

			// Need to create temporaries and copy over to access chain after.
			// We cannot directly take the reference of a vector swizzle in MSL, even if it's scalar ...
			uint32_t &tmp_id = extra_sub_expressions[id];
			if (!tmp_id)
				tmp_id = ir.increase_bound_by(1);

			uint32_t tmp_type_id = get_pointee_type_id(expression_type_id(args[1]));
			emit_uninitialized_temporary_expression(tmp_type_id, tmp_id);
			emit_binary_func_op(result_type, id, args[0], tmp_id, eop == GLSLstd450Modf ? "modf" : "frexp");
			statement(to_expression(args[1]), " = ", to_expression(tmp_id), ";");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}

	case GLSLstd450Pow:
		// powr makes x < 0.0 undefined, just like SPIR-V.
		emit_binary_func_op(result_type, id, args[0], args[1], "powr");
		break;

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}